

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_top_n.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalTopN *op)

{
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar1;
  PhysicalOperator *pPVar2;
  reference_wrapper<duckdb::PhysicalOperator> local_30;
  idx_t local_28;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_00);
  pPVar1 = CreatePlan(this,op_00);
  local_30._M_data = (PhysicalOperator *)op->limit;
  local_28 = op->offset;
  pPVar2 = Make<duckdb::PhysicalTopN,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,unsigned_long,duckdb::shared_ptr<duckdb::DynamicFilterData,true>,unsigned_long&>
                     (this,&(op->super_LogicalOperator).types,&op->orders,(unsigned_long *)&local_30
                      ,&local_28,&op->dynamic_filter,
                      &(op->super_LogicalOperator).estimated_cardinality);
  local_30._M_data = pPVar1;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&pPVar2->children,&local_30);
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalTopN &op) {
	D_ASSERT(op.children.size() == 1);
	auto &plan = CreatePlan(*op.children[0]);
	auto &top_n =
	    Make<PhysicalTopN>(op.types, std::move(op.orders), NumericCast<idx_t>(op.limit), NumericCast<idx_t>(op.offset),
	                       std::move(op.dynamic_filter), op.estimated_cardinality);
	top_n.children.push_back(plan);
	return top_n;
}